

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O0

uint32_t spvtools::val::anon_unknown_0::GetMinCoordSize(Op opcode,ImageTypeInfo *info)

{
  uint32_t uVar1;
  bool bVar2;
  uint32_t uVar3;
  ImageTypeInfo *info_local;
  Op opcode_local;
  
  if ((info->dim == Cube) &&
     (((opcode == OpImageRead || (opcode == OpImageWrite)) || (opcode == OpImageSparseRead)))) {
    info_local._4_4_ = 3;
  }
  else {
    uVar3 = GetPlaneCoordSize(info);
    uVar1 = info->arrayed;
    bVar2 = IsProj(opcode);
    info_local._4_4_ = uVar3 + uVar1 + (uint)bVar2;
  }
  return info_local._4_4_;
}

Assistant:

uint32_t GetMinCoordSize(spv::Op opcode, const ImageTypeInfo& info) {
  if (info.dim == spv::Dim::Cube &&
      (opcode == spv::Op::OpImageRead || opcode == spv::Op::OpImageWrite ||
       opcode == spv::Op::OpImageSparseRead)) {
    // These opcodes use UV for Cube, not direction vector.
    return 3;
  }

  return GetPlaneCoordSize(info) + info.arrayed + (IsProj(opcode) ? 1 : 0);
}